

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O1

int decoder_get_uint32_value(ndn_decoder_t *decoder,uint32_t *value)

{
  uint8_t *puVar1;
  int iVar2;
  int i;
  int iVar3;
  
  iVar2 = -10;
  if (decoder->offset + 4 <= decoder->input_size) {
    *value = 0;
    puVar1 = decoder->input_value;
    iVar3 = 0;
    iVar2 = 0x18;
    do {
      *value = *value + ((uint)puVar1[decoder->offset + iVar3] << ((byte)iVar2 & 0x1f));
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + -8;
    } while (iVar2 != -8);
    decoder->offset = decoder->offset + 4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static inline int
decoder_get_uint32_value(ndn_decoder_t* decoder, uint32_t* value)
{
  if (decoder->offset + 4 > decoder->input_size)
    return NDN_OVERSIZE;
  *value = 0;
  for (int i = 0; i < 4; i++) {
    *value += (uint32_t)decoder->input_value[decoder->offset + i] << (8 * (3 - i));
  }
  decoder->offset += 4;
  return 0;
}